

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DefaultCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultCaseItemSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SyntaxNode&>
          (BumpAllocator *this,Token *args,Token *args_1,SyntaxNode *args_2)

{
  Token defaultKeyword;
  Token colon;
  DefaultCaseItemSyntax *this_00;
  SyntaxNode *args_local_2;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (DefaultCaseItemSyntax *)allocate(this,0x38,8);
  defaultKeyword.kind = args->kind;
  defaultKeyword._2_1_ = args->field_0x2;
  defaultKeyword.numFlags.raw = (args->numFlags).raw;
  defaultKeyword.rawLen = args->rawLen;
  defaultKeyword.info = args->info;
  colon.kind = args_1->kind;
  colon._2_1_ = args_1->field_0x2;
  colon.numFlags.raw = (args_1->numFlags).raw;
  colon.rawLen = args_1->rawLen;
  colon.info = args_1->info;
  slang::syntax::DefaultCaseItemSyntax::DefaultCaseItemSyntax(this_00,defaultKeyword,colon,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }